

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper::
~initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper
          (initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper *this)

{
  ~initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper
            ((initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_InvalidSessionHeader_NoSessionReturned)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "35=A" + delimSOH //header out of order;
      + "9=100" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr == actualSession);
}